

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O2

void __thiscall
Args::Arg::Arg<std::__cxx11::string>
          (Arg *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,
          bool isWithValue,bool isRequired)

{
  allocator local_21;
  
  (this->super_ArgIface).m_cmdLine = (CmdLine *)0x0;
  (this->super_ArgIface)._vptr_ArgIface = (_func_int **)&PTR__Arg_0012caa0;
  this->m_isWithValue = isWithValue;
  this->m_isRequired = isRequired;
  this->m_isDefined = false;
  (this->m_value)._M_dataplus._M_p = (pointer)&(this->m_value).field_2;
  (this->m_value)._M_string_length = 0;
  (this->m_value).field_2._M_local_buf[0] = '\0';
  (this->m_flag)._M_dataplus._M_p = (pointer)&(this->m_flag).field_2;
  (this->m_flag)._M_string_length = 0;
  (this->m_flag).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  std::__cxx11::string::string((string *)&this->m_valueSpecifier,"arg",&local_21);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  (this->m_longDescription)._M_dataplus._M_p = (pointer)&(this->m_longDescription).field_2;
  (this->m_longDescription)._M_string_length = 0;
  (this->m_longDescription).field_2._M_local_buf[0] = '\0';
  (this->m_defaultValue)._M_dataplus._M_p = (pointer)&(this->m_defaultValue).field_2;
  (this->m_defaultValue)._M_string_length = 0;
  (this->m_defaultValue).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Arg::Arg( T && name,
	bool isWithValue, bool isRequired )
	:	m_isWithValue( isWithValue )
	,	m_isRequired( isRequired )
	,	m_isDefined( false )
	,	m_name( std::forward< T > ( name ) )
	,	m_valueSpecifier( SL( "arg" ) )
{
}